

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O3

bool spvtools::val::anon_unknown_2::AreLayoutCompatibleStructs
               (ValidationState_t *_,Instruction *type1,Instruction *type2)

{
  uint32_t id;
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  undefined8 in_RAX;
  Instruction *type1_00;
  Instruction *type2_00;
  pointer psVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  pointer psVar9;
  ulong uVar10;
  _Rb_tree_header *p_Var11;
  _Rb_tree_header *p_Var12;
  undefined8 local_38;
  
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  if (((type1->inst_).opcode == 0x1e) && ((type2->inst_).opcode == 0x1e)) {
    psVar4 = (type1->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    psVar9 = (type1->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if ((long)psVar9 - (long)psVar4 ==
        (long)(type2->operands_).
              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(type2->operands_).
              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      if (0x20 < (ulong)((long)psVar9 - (long)psVar4)) {
        uVar10 = 2;
        local_38 = in_RAX;
        do {
          id = (type1->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar10];
          if (id != (type2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10]) {
            type1_00 = ValidationState_t::FindDef(_,id);
            type2_00 = ValidationState_t::FindDef
                                 (_,(type2->words_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar10]);
            bVar3 = AreLayoutCompatibleStructs(_,type1_00,type2_00);
            if (!bVar3) {
              return false;
            }
            psVar4 = (type1->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            psVar9 = (type1->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)psVar9 - (long)psVar4 >> 4));
        if ((type1->inst_).opcode != 0x1e) {
          __assert_fail("type1->opcode() == spv::Op::OpTypeStruct && \"type1 must be an OpTypeStruct instruction.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp"
                        ,0x69,
                        "bool spvtools::val::(anonymous namespace)::HaveSameLayoutDecorations(ValidationState_t &, const Instruction *, const Instruction *)"
                       );
        }
      }
      if ((type2->inst_).opcode != 0x1e) {
        __assert_fail("type2->opcode() == spv::Op::OpTypeStruct && \"type2 must be an OpTypeStruct instruction.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp"
                      ,0x6b,
                      "bool spvtools::val::(anonymous namespace)::HaveSameLayoutDecorations(ValidationState_t &, const Instruction *, const Instruction *)"
                     );
      }
      local_38 = CONCAT44(local_38._4_4_,(type1->inst_).result_id);
      pmVar5 = std::
               map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
               ::operator[](&_->id_decorations_,(key_type_conflict *)&local_38);
      local_38 = CONCAT44((type2->inst_).result_id,(key_type_conflict)local_38);
      pmVar6 = std::
               map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
               ::operator[](&_->id_decorations_,(key_type_conflict *)((long)&local_38 + 4));
      p_Var8 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var12 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var8 == p_Var12) {
        return true;
      }
      p_Var2 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var11 = &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
      do {
        if (p_Var8[1]._M_color == 0x23) {
          p_Var7 = p_Var2;
          if ((_Rb_tree_header *)p_Var2 != p_Var11) {
            _Var1 = p_Var8[2]._M_color;
            do {
              if ((p_Var7[1]._M_color == 0x23) && (p_Var7[2]._M_color == _Var1)) break;
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
            } while ((_Rb_tree_header *)p_Var7 != p_Var11);
          }
          if (((_Rb_tree_header *)p_Var7 != p_Var11) &&
             ((p_Var8[1]._M_parent)->_M_color != (p_Var7[1]._M_parent)->_M_color)) {
            return false;
          }
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        if ((_Rb_tree_header *)p_Var8 == p_Var12) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool AreLayoutCompatibleStructs(ValidationState_t& _, const Instruction* type1,
                                const Instruction* type2) {
  if (type1->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }
  if (type2->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }

  if (!HaveLayoutCompatibleMembers(_, type1, type2)) return false;

  return HaveSameLayoutDecorations(_, type1, type2);
}